

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

size_t absl::lts_20250127::cord_internal::anon_unknown_0::
       GetEstimatedUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                 (Nonnull<const_CordRep_*> rep)

{
  bool bVar1;
  CordRepCrc *pCVar2;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage_00;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> CVar3;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  Nonnull<const_CordRep_*> local_50;
  Nonnull<const_CordRep_*> local_48;
  undefined1 local_30 [8];
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> repref;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> raw_usage;
  Nonnull<const_CordRep_*> rep_local;
  
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::RawUsage
            ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)
             &repref.fraction);
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::CordRepRef
            ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)
             local_30,rep,1.0);
  if (*(uint8_t *)((long)local_30 + 0xc) == '\x02') {
    CVar3.fraction = (double)repref.rep;
    CVar3.rep = (Nonnull<const_CordRep_*>)local_30;
    RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Add
              ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)
               &repref.fraction,0x20,CVar3);
    pCVar2 = CordRep::crc((CordRep *)local_30);
    if (pCVar2->child == (CordRep *)0x0) {
      return (long)repref.fraction |
             (long)(repref.fraction - 9.223372036854776e+18) & (long)repref.fraction >> 0x3f;
    }
    pCVar2 = CordRep::crc((CordRep *)local_30);
    CVar3 = CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Child
                      ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                        *)local_30,pCVar2->child);
    local_50 = CVar3.rep;
    local_30 = (undefined1  [8])local_50;
    local_48 = (Nonnull<const_CordRep_*>)CVar3.fraction;
    repref.rep = local_48;
  }
  bVar1 = IsDataEdge((CordRep *)local_30);
  if (bVar1) {
    rep_00.fraction = (double)repref.rep;
    rep_00.rep = (Nonnull<const_CordRep_*>)&repref.fraction;
    AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
              ((anon_unknown_0 *)local_30,rep_00,raw_usage_00);
  }
  else {
    if (*(uint8_t *)((long)local_30 + 0xc) != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                   );
    }
    rep_01.fraction = (double)repref.rep;
    rep_01.rep = (Nonnull<const_CordRep_*>)&repref.fraction;
    AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
              ((anon_unknown_0 *)local_30,rep_01,raw_usage_00);
  }
  return (long)repref.fraction |
         (long)(repref.fraction - 9.223372036854776e+18) & (long)repref.fraction >> 0x3f;
}

Assistant:

size_t GetEstimatedUsage(absl::Nonnull<const CordRep*> rep) {
  // Zero initialized memory usage totals.
  RawUsage<mode> raw_usage;

  // Capture top level node and refcount into a CordRepRef.
  CordRepRef<mode> repref(rep);

  // Consume the top level CRC node if present.
  if (repref.rep->tag == CRC) {
    raw_usage.Add(sizeof(CordRepCrc), repref);
    if (repref.rep->crc()->child == nullptr) {
      return static_cast<size_t>(raw_usage.total);
    }
    repref = repref.Child(repref.rep->crc()->child);
  }

  if (IsDataEdge(repref.rep)) {
    AnalyzeDataEdge(repref, raw_usage);
  } else if (repref.rep->tag == BTREE) {
    AnalyzeBtree(repref, raw_usage);
  } else {
    assert(false);
  }

  return static_cast<size_t>(raw_usage.total);
}